

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackTypeValidator::validateBuiltinVariable
          (TransformFeedbackTypeValidator *this,string *resource,GLint propValue,
          string *implementationName)

{
  ostringstream *this_00;
  TestContext *this_01;
  int iVar1;
  DataType DVar2;
  char *pcVar3;
  size_t sVar4;
  DataType DVar5;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  iVar1 = std::__cxx11::string::compare((char *)resource);
  local_1a8._0_8_ =
       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verifying type, expecting ",0x1a);
  DVar5 = (uint)(iVar1 == 0) * 4;
  pcVar3 = glu::getDataTypeName(DVar5);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1a8._8_8_ + -0x18));
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,sVar4);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  DVar2 = glu::getDataTypeFromGLType(propValue);
  if (DVar2 != DVar5) {
    local_1a8._0_8_ =
         ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tError, got ",0xc);
    DVar5 = glu::getDataTypeFromGLType(propValue);
    pcVar3 = glu::getDataTypeName(DVar5);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1a8._8_8_ + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"resource type invalid","");
    this_01 = (this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,(char *)local_1a8._0_8_);
    }
    if ((TestLog *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)&(local_198[0].m_log)->flags + 1));
    }
  }
  return;
}

Assistant:

void TransformFeedbackTypeValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(implementationName);

	glu::DataType varType = glu::TYPE_INVALID;

	if (resource == "gl_Position")
		varType = glu::TYPE_FLOAT_VEC4;
	else
		DE_ASSERT(false);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(varType) << tcu::TestLog::EndMessage;
	if (glu::getDataTypeFromGLType(propValue) != varType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
	return;
}